

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::InitFrom(Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
           *this,Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                 *other)

{
  bool bVar1;
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> SVar2;
  allocator<absl::lts_20250127::status_internal::Payload> *paVar3;
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> *pSVar4;
  Allocation<std::allocator<absl::lts_20250127::status_internal::Payload>_> allocation_00;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_const_absl::lts_20250127::status_internal::Payload_*>
  local_68;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_const_absl::lts_20250127::status_internal::Payload_*>
  values;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> local_50;
  Allocation<std::allocator<absl::lts_20250127::status_internal::Payload>_> allocation;
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> requested_capacity;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> dst;
  ConstPointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> src;
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> local_20;
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> n;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *other_local;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *this_local;
  
  n = (SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_>)other;
  other_local = this;
  local_20 = GetSize(other);
  if (local_20 == 0) {
    InitFrom::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)((long)&src + 7));
  }
  bVar1 = GetIsAllocated((Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                          *)n);
  if (bVar1) {
    SVar2 = GetInlinedCapacity(this);
    SVar2 = ComputeCapacity(SVar2,local_20);
    paVar3 = GetAllocator(this);
    allocation_00 =
         MallocAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_false>::
         Allocate(paVar3,SVar2);
    local_50 = allocation_00.data;
    values.it_ = local_50;
    SetAllocation(this,allocation_00);
    requested_capacity =
         (SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_>)local_50;
    dst = GetAllocatedData((Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                            *)n);
  }
  else {
    requested_capacity =
         (SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
         GetInlinedData(this);
    dst = GetInlinedData((Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                          *)n);
  }
  IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_const_absl::lts_20250127::status_internal::Payload_*>
  ::IteratorValueAdapter(&local_68,&dst);
  paVar3 = GetAllocator(this);
  ConstructElements<std::allocator<absl::lts_20250127::status_internal::Payload>,absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,absl::lts_20250127::status_internal::Payload_const*>>
            (paVar3,(Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                    requested_capacity,&local_68,local_20);
  pSVar4 = GetSizeAndIsAllocated
                     ((Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                       *)n);
  SVar2 = *pSVar4;
  pSVar4 = GetSizeAndIsAllocated(this);
  *pSVar4 = SVar2;
  return;
}

Assistant:

void Storage<T, N, A>::InitFrom(const Storage& other) {
  const SizeType<A> n = other.GetSize();
  ABSL_HARDENING_ASSERT(n > 0);  // Empty sources handled handled in caller.
  ConstPointer<A> src;
  Pointer<A> dst;
  if (!other.GetIsAllocated()) {
    dst = GetInlinedData();
    src = other.GetInlinedData();
  } else {
    // Because this is only called from the `InlinedVector` constructors, it's
    // safe to take on the allocation with size `0`. If `ConstructElements(...)`
    // throws, deallocation will be automatically handled by `~Storage()`.
    SizeType<A> requested_capacity = ComputeCapacity(GetInlinedCapacity(), n);
    Allocation<A> allocation =
        MallocAdapter<A>::Allocate(GetAllocator(), requested_capacity);
    SetAllocation(allocation);
    dst = allocation.data;
    src = other.GetAllocatedData();
  }

  // Fast path: if the value type is trivially copy constructible and we know
  // the allocator doesn't do anything fancy, then we know it is legal for us to
  // simply memcpy the other vector's elements.
  if (absl::is_trivially_copy_constructible<ValueType<A>>::value &&
      std::is_same<A, std::allocator<ValueType<A>>>::value) {
    std::memcpy(reinterpret_cast<char*>(dst),
                reinterpret_cast<const char*>(src), n * sizeof(ValueType<A>));
  } else {
    auto values = IteratorValueAdapter<A, ConstPointer<A>>(src);
    ConstructElements<A>(GetAllocator(), dst, values, n);
  }

  GetSizeAndIsAllocated() = other.GetSizeAndIsAllocated();
}